

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

void apu_regwrite(nesapu_state *info,uint8 offset,uint8 value)

{
  uint uVar1;
  int chan;
  uint8 value_local;
  uint8 offset_local;
  nesapu_state *info_local;
  
  uVar1 = (offset & 4) >> 2;
  switch(offset) {
  case '\0':
  case '\x04':
    (info->APU).squ[(int)uVar1].regs[0] = value;
    break;
  case '\x01':
  case '\x05':
    (info->APU).squ[(int)uVar1].regs[1] = value;
    break;
  case '\x02':
  case '\x06':
    (info->APU).squ[(int)uVar1].regs[2] = value;
    if (((info->APU).squ[(int)uVar1].enabled & 1U) != 0) {
      (info->APU).squ[(int)uVar1].freq =
           (((info->APU).squ[(int)uVar1].regs[3] & 7) * 0x100 + (uint)value + 1) * 0x10000;
    }
    break;
  case '\x03':
  case '\a':
    (info->APU).squ[(int)uVar1].regs[3] = value;
    if (((info->APU).squ[(int)uVar1].enabled & 1U) != 0) {
      (info->APU).squ[(int)uVar1].vbl_length = info->vbl_times[(int)(uint)value >> 3];
      (info->APU).squ[(int)uVar1].env_vol = '\0';
      (info->APU).squ[(int)uVar1].freq =
           ((value & 7) * 0x100 + (uint)(info->APU).squ[(int)uVar1].regs[2] + 1) * 0x10000;
    }
    break;
  case '\b':
    (info->APU).tri.regs[0] = value;
    if ((((info->APU).tri.enabled & 1U) != 0) && (((info->APU).tri.counter_started & 1U) == 0)) {
      (info->APU).tri.linear_length = info->sync_times2[(int)(value & 0x7f)];
    }
    break;
  case '\t':
    (info->APU).tri.regs[1] = value;
    break;
  case '\n':
    (info->APU).tri.regs[2] = value;
    break;
  case '\v':
    (info->APU).tri.regs[3] = value;
    (info->APU).tri.write_latency = (info->samps_per_sync + 0xef) / 0xf0;
    if (((info->APU).tri.enabled & 1U) != 0) {
      (info->APU).tri.counter_started = false;
      (info->APU).tri.vbl_length = info->vbl_times[(int)(uint)value >> 3];
      (info->APU).tri.linear_length = info->sync_times2[(int)((info->APU).tri.regs[0] & 0x7f)];
      (info->APU).tri.linear_reload = true;
    }
    break;
  case '\f':
    (info->APU).noi.regs[0] = value;
    break;
  case '\r':
    (info->APU).noi.regs[1] = value;
    break;
  case '\x0e':
    (info->APU).noi.regs[2] = value;
    break;
  case '\x0f':
    (info->APU).noi.regs[3] = value;
    if (((info->APU).noi.enabled & 1U) != 0) {
      (info->APU).noi.vbl_length = info->vbl_times[(int)(uint)value >> 3];
      (info->APU).noi.env_vol = '\0';
    }
    break;
  case '\x10':
    (info->APU).dpcm.regs[0] = value;
    if ((value & 0x80) == 0) {
      (info->APU).dpcm.irq_occurred = false;
    }
    break;
  case '\x11':
    (info->APU).dpcm.regs[1] = value & 0x7f;
    if (DPCMBase0 == '\0') {
      (info->APU).dpcm.vol = (info->APU).dpcm.regs[1] - 0x40;
    }
    else {
      (info->APU).dpcm.vol = (ushort)(info->APU).dpcm.regs[1];
    }
    break;
  case '\x12':
    (info->APU).dpcm.regs[2] = value;
    break;
  case '\x13':
    (info->APU).dpcm.regs[3] = value;
    break;
  default:
    break;
  case '\x15':
    if ((value & 1) == 0) {
      (info->APU).squ[0].enabled = false;
      (info->APU).squ[0].vbl_length = 0;
    }
    else {
      (info->APU).squ[0].enabled = true;
    }
    if ((value & 2) == 0) {
      (info->APU).squ[1].enabled = false;
      (info->APU).squ[1].vbl_length = 0;
    }
    else {
      (info->APU).squ[1].enabled = true;
    }
    if ((value & 4) == 0) {
      (info->APU).tri.enabled = false;
      (info->APU).tri.vbl_length = 0;
      (info->APU).tri.linear_length = 0;
      (info->APU).tri.counter_started = false;
      (info->APU).tri.write_latency = 0;
    }
    else {
      (info->APU).tri.enabled = true;
    }
    if ((value & 8) == 0) {
      (info->APU).noi.enabled = false;
      (info->APU).noi.vbl_length = 0;
    }
    else {
      (info->APU).noi.enabled = true;
    }
    if ((value & 0x10) == 0) {
      (info->APU).dpcm.enabled = false;
    }
    else if (((info->APU).dpcm.enabled & 1U) == 0) {
      (info->APU).dpcm.enabled = true;
      apu_dpcmreset(&(info->APU).dpcm);
    }
    (info->APU).dpcm.irq_occurred = false;
    break;
  case '\x17':
    if ((value & 0x80) == 0) {
      (info->APU).step_mode = '\x04';
    }
    else {
      (info->APU).step_mode = '\x05';
    }
    (info->APU).frame_irq_enabled = (((int)(uint)value >> 6 & 1U) != 0 ^ 0xffU) & 1;
    if ((info->APU).frame_irq_enabled == '\0') {
      (info->APU).frame_irq_occurred = '\0';
    }
  }
  return;
}

Assistant:

INLINE void apu_regwrite(nesapu_state *info, uint8 offset, uint8 value)
{
	int chan = (offset & 4) ? 1 : 0;

	switch (offset)
	{
	/* squares */
	case APU_WRA0:
	case APU_WRB0:
		info->APU.squ[chan].regs[0] = value;
		break;

	case APU_WRA1:
	case APU_WRB1:
		info->APU.squ[chan].regs[1] = value;
		break;

	case APU_WRA2:
	case APU_WRB2:
		info->APU.squ[chan].regs[2] = value;
		if (info->APU.squ[chan].enabled)
			info->APU.squ[chan].freq = ((((info->APU.squ[chan].regs[3] & 7) << 8) + value) + 1) << 16;
		break;

	case APU_WRA3:
	case APU_WRB3:
		info->APU.squ[chan].regs[3] = value;

		if (info->APU.squ[chan].enabled)
		{
			info->APU.squ[chan].vbl_length = info->vbl_times[value >> 3];
			info->APU.squ[chan].env_vol = 0;
			info->APU.squ[chan].freq = ((((value & 7) << 8) + info->APU.squ[chan].regs[2]) + 1) << 16;
		}

		break;

	/* triangle */
	case APU_WRC0:
		info->APU.tri.regs[0] = value;

		if (info->APU.tri.enabled)
		{                                          /* ??? */
			if (!info->APU.tri.counter_started)
				info->APU.tri.linear_length = info->sync_times2[value & 0x7f];
		}

		break;

	//case 0x4009:
	case APU_WRC1:
		/* unused */
		info->APU.tri.regs[1] = value;
		break;

	case APU_WRC2:
		info->APU.tri.regs[2] = value;
		break;

	case APU_WRC3:
		info->APU.tri.regs[3] = value;

		/* this is somewhat of a hack.  there is some latency on the Real
		** Thing between when trireg0 is written to and when the linear
		** length counter actually begins its countdown.  we want to prevent
		** the case where the program writes to the freq regs first, then
		** to reg 0, and the counter accidentally starts running because of
		** the sound queue's timestamp processing.
		**
		** set to a few NES sample -- should be sufficient
		**
		**    3 * (1789772.727 / 44100) = ~122 cycles, just around one scanline
		**
		** should be plenty of time for the 6502 code to do a couple of table
		** dereferences and load up the other triregs
		*/

	/* used to be 3, but now we run the clock faster, so base it on samples/sync */
		info->APU.tri.write_latency = (info->samps_per_sync + 239) / 240;

		if (info->APU.tri.enabled)
		{
			info->APU.tri.counter_started = false;
			info->APU.tri.vbl_length = info->vbl_times[value >> 3];
			info->APU.tri.linear_length = info->sync_times2[info->APU.tri.regs[0] & 0x7f];
			info->APU.tri.linear_reload = true;
		}

		break;

	/* noise */
	case APU_WRD0:
		info->APU.noi.regs[0] = value;
		break;

	case 0x0D:
		/* unused */
		info->APU.noi.regs[1] = value;
		break;

	case APU_WRD2:
		info->APU.noi.regs[2] = value;
		break;

	case APU_WRD3:
		info->APU.noi.regs[3] = value;

		if (info->APU.noi.enabled)
		{
			info->APU.noi.vbl_length = info->vbl_times[value >> 3];
			info->APU.noi.env_vol = 0; /* reset envelope */
		}
		break;

	/* DMC */
	case APU_WRE0:
		info->APU.dpcm.regs[0] = value;
		if (!(value & 0x80))
		{
			info->APU.dpcm.irq_occurred = false;
			//if (!info->APU.frame_irq_occurred)
			//	info->irq_handler(false);
		}
		break;

	case APU_WRE1: /* 7-bit DAC */
		info->APU.dpcm.regs[1] = value & 0x7f;
		if (!DPCMBase0)
			info->APU.dpcm.vol = (info->APU.dpcm.regs[1]-64);
		else
			info->APU.dpcm.vol = info->APU.dpcm.regs[1];
		break;

	case APU_WRE2:
		info->APU.dpcm.regs[2] = value;
		//apu_dpcmreset(info->APU.dpcm);
		break;

	case APU_WRE3:
		info->APU.dpcm.regs[3] = value;
		break;

	case APU_IRQCTRL:
		if (value & 0x80)
			info->APU.step_mode = 5;
		else
			info->APU.step_mode = 4;

		info->APU.frame_irq_enabled = !BIT(value, 6);
		if (info->APU.frame_irq_enabled)
		{
			//info->frame_timer->adjust(info->frame_period, 0, info->frame_period);
		}
		else
		{
			info->APU.frame_irq_occurred = false;
			//if (!info->APU.dpcm.irq_occurred)
			//	info->irq_handler(false);
			//info->frame_timer->reset();
		}

		break;

	case APU_SMASK:
		if (value & 0x01)
			info->APU.squ[0].enabled = true;
		else
		{
			info->APU.squ[0].enabled = false;
			info->APU.squ[0].vbl_length = 0;
		}

		if (value & 0x02)
			info->APU.squ[1].enabled = true;
		else
		{
			info->APU.squ[1].enabled = false;
			info->APU.squ[1].vbl_length = 0;
		}

		if (value & 0x04)
			info->APU.tri.enabled = true;
		else
		{
			info->APU.tri.enabled = false;
			info->APU.tri.vbl_length = 0;
			info->APU.tri.linear_length = 0;
			info->APU.tri.counter_started = false;
			info->APU.tri.write_latency = 0;
		}

		if (value & 0x08)
			info->APU.noi.enabled = true;
		else
		{
			info->APU.noi.enabled = false;
			info->APU.noi.vbl_length = 0;
		}

		if (value & 0x10)
		{
			/* only reset dpcm values if DMA is finished */
			if (!info->APU.dpcm.enabled)
			{
				info->APU.dpcm.enabled = true;
				apu_dpcmreset(&info->APU.dpcm);
			}
		}
		else
			info->APU.dpcm.enabled = false;

		info->APU.dpcm.irq_occurred = false;
		//if (!info->APU.frame_irq_occurred)
		//	info->irq_handler(false);

		break;
	default:
#ifdef MAME_DEBUG
logerror("invalid apu write: $%02X at $%04X\n", value, offset);
#endif
		break;
	}
}